

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void * __thiscall
Memory::Recycler::TrackAlloc
          (Recycler *this,void *object,size_t size,TrackAllocData *trackAllocData,bool traceLifetime
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    bVar2 = TrackAllocData::IsEmpty(&this->nextAllocData);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x203e,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
    TrackAllocCore(this,object,size,trackAllocData,false);
    CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
  }
  return object;
}

Assistant:

void* Recycler::TrackAlloc(void* object, size_t size, const TrackAllocData& trackAllocData, bool traceLifetime)
{
    if (this->trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty()); // should have been cleared
        trackerCriticalSection->Enter();
        TrackAllocCore(object, size, trackAllocData);
        trackerCriticalSection->Leave();
    }
    return object;
}